

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahrens_beylkin.hpp
# Opt level: O0

int64_t IntegratorXX::quadrature_traits<IntegratorXX::AhrensBeylkin<double>,_void>::
        npts_by_algebraic_order(int64_t order)

{
  int64_t order_local;
  
  switch(order) {
  case 0xe:
    order_local = 0x48;
    break;
  default:
    order_local = -1;
    break;
  case 0x13:
    order_local = 0x84;
    break;
  case 0x17:
    order_local = 0xc0;
    break;
  case 0x1d:
    order_local = 0x138;
    break;
  case 0x20:
    order_local = 0x174;
    break;
  case 0x23:
    order_local = 0x1b0;
    break;
  case 0x25:
    order_local = 0x1ec;
    break;
  case 0x27:
    order_local = 0x228;
    break;
  case 0x29:
    order_local = 0x264;
    break;
  case 0x2c:
    order_local = 0x2a0;
    break;
  case 0x2d:
    order_local = 0x2dc;
    break;
  case 0x2f:
    order_local = 0x318;
    break;
  case 0x33:
    order_local = 0x390;
    break;
  case 0x35:
    order_local = 0x3cc;
    break;
  case 0x36:
    order_local = 0x408;
    break;
  case 0x38:
    order_local = 0x444;
    break;
  case 0x3c:
    order_local = 0x4f8;
    break;
  case 0x3e:
    order_local = 0x534;
    break;
  case 0x3f:
    order_local = 0x570;
    break;
  case 0x42:
    order_local = 0x5e8;
    break;
  case 0x43:
    order_local = 0x624;
    break;
  case 0x45:
    order_local = 0x660;
    break;
  case 0x46:
    order_local = 0x69c;
    break;
  case 0x48:
    order_local = 0x714;
    break;
  case 0x4b:
    order_local = 0x78c;
    break;
  case 0x4c:
    order_local = 0x7c8;
    break;
  case 0x4e:
    order_local = 0x840;
    break;
  case 0x4f:
    order_local = 0x87c;
    break;
  case 0x50:
    order_local = 0x8b8;
    break;
  case 0x51:
    order_local = 0x8f4;
    break;
  case 0x54:
    order_local = 0x96c;
    break;
  case 0x55:
    order_local = 0x9a8;
    break;
  case 0x59:
    order_local = 0xa98;
    break;
  case 0x5a:
    order_local = 0xad4;
    break;
  case 0x5b:
    order_local = 0xb10;
    break;
  case 0x5e:
    order_local = 0xbc4;
    break;
  case 0x62:
    order_local = 0xcf0;
    break;
  case 99:
    order_local = 0xd2c;
    break;
  case 100:
    order_local = 0xd68;
    break;
  case 0x65:
    order_local = 0xda4;
    break;
  case 0x67:
    order_local = 0xe1c;
    break;
  case 0x69:
    order_local = 0xed0;
    break;
  case 0x6f:
    order_local = 0x1074;
    break;
  case 0x71:
    order_local = 0x10ec;
    break;
  case 0x74:
    order_local = 0x11dc;
    break;
  case 0x75:
    order_local = 0x1254;
    break;
  case 0x79:
    order_local = 0x1380;
    break;
  case 0x7c:
    order_local = 0x1470;
    break;
  case 0x7f:
    order_local = 0x1560;
    break;
  case 0x80:
    order_local = 0x15d8;
    break;
  case 0x82:
    order_local = 0x168c;
    break;
  case 0x87:
    order_local = 0x1830;
    break;
  case 0x88:
    order_local = 0x18a8;
    break;
  case 0x8f:
    order_local = 0x1b00;
    break;
  case 0x95:
    order_local = 0x1d58;
    break;
  case 0xd2:
    order_local = 0x3aa4;
  }
  return order_local;
}

Assistant:

inline static int64_t npts_by_algebraic_order(int64_t order) {
  switch (order) {
  case 14:
    return 72;
  case 19:
    return 132;
  case 23:
    return 192;
  case 29:
    return 312;
  case 32:
    return 372;
  case 35:
    return 432;
  case 37:
    return 492;
  case 39:
    return 552;
  case 41:
    return 612;
  case 44:
    return 672;
  case 45:
    return 732;
  case 47:
    return 792;
  case 51:
    return 912;
  case 53:
    return 972;
  case 54:
    return 1032;
  case 56:
    return 1092;
  case 60:
    return 1272;
  case 62:
    return 1332;
  case 63:
    return 1392;
  case 66:
    return 1512;
  case 67:
    return 1572;
  case 69:
    return 1632;
  case 70:
    return 1692;
  case 72:
    return 1812;
  case 75:
    return 1932;
  case 76:
    return 1992;
  case 78:
    return 2112;
  case 79:
    return 2172;
  case 80:
    return 2232;
  case 81:
    return 2292;
  case 84:
    return 2412;
  case 85:
    return 2472;
  case 89:
    return 2712;
  case 90:
    return 2772;
  case 91:
    return 2832;
  case 94:
    return 3012;
  case 98:
    return 3312;
  case 99:
    return 3372;
  case 100:
    return 3432;
  case 101:
    return 3492;
  case 103:
    return 3612;
  case 105:
    return 3792;
  case 111:
    return 4212;
  case 113:
    return 4332;
  case 116:
    return 4572;
  case 117:
    return 4692;
  case 121:
    return 4992;
  case 124:
    return 5232;
  case 127:
    return 5472;
  case 128:
    return 5592;
  case 130:
    return 5772;
  case 135:
    return 6192;
  case 136:
    return 6312;
  case 143:
    return 6912;
  case 149:
    return 7512;
  case 210:
    return 15012;
  default:
    return -1;
  }
}